

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crypter.cpp
# Opt level: O2

bool __thiscall
wallet::CCrypter::Encrypt
          (CCrypter *this,CKeyingMaterial *vchPlaintext,
          vector<unsigned_char,_std::allocator<unsigned_char>_> *vchCiphertext)

{
  long lVar1;
  uchar *data;
  int iVar2;
  ulong uVar3;
  bool bVar4;
  size_type __new_size;
  long in_FS_OFFSET;
  AES256CBCEncrypt enc;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  if (this->fKeySet == true) {
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
              (vchCiphertext,
               (size_type)
               ((vchPlaintext->super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>).
                _M_impl.super__Vector_impl_data._M_finish +
               (0x10 - (long)(vchPlaintext->
                             super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>).
                             _M_impl.super__Vector_impl_data._M_start)));
    AES256CBCEncrypt::AES256CBCEncrypt
              (&enc,(this->vchKey).
                    super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start,
               (this->vchIV).super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>.
               _M_impl.super__Vector_impl_data._M_start,true);
    data = (vchPlaintext->super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>).
           _M_impl.super__Vector_impl_data._M_start;
    iVar2 = AES256CBCEncrypt::Encrypt
                      (&enc,data,
                       *(int *)&(vchPlaintext->
                                super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>)
                                ._M_impl.super__Vector_impl_data._M_finish - (int)data,
                       (vchCiphertext->
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                       super__Vector_impl_data._M_start);
    uVar3 = (long)(vchPlaintext->super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>
                  )._M_impl.super__Vector_impl_data._M_finish -
            (long)(vchPlaintext->super__Vector_base<unsigned_char,_secure_allocator<unsigned_char>_>
                  )._M_impl.super__Vector_impl_data._M_start;
    __new_size = (size_type)iVar2;
    bVar4 = uVar3 <= __new_size;
    if (uVar3 <= __new_size) {
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(vchCiphertext,__new_size);
    }
    AES256CBCEncrypt::~AES256CBCEncrypt(&enc);
  }
  else {
    bVar4 = false;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar4;
  }
  __stack_chk_fail();
}

Assistant:

bool CCrypter::Encrypt(const CKeyingMaterial& vchPlaintext, std::vector<unsigned char> &vchCiphertext) const
{
    if (!fKeySet)
        return false;

    // max ciphertext len for a n bytes of plaintext is
    // n + AES_BLOCKSIZE bytes
    vchCiphertext.resize(vchPlaintext.size() + AES_BLOCKSIZE);

    AES256CBCEncrypt enc(vchKey.data(), vchIV.data(), true);
    size_t nLen = enc.Encrypt(vchPlaintext.data(), vchPlaintext.size(), vchCiphertext.data());
    if(nLen < vchPlaintext.size())
        return false;
    vchCiphertext.resize(nLen);

    return true;
}